

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_disconnect(Curl_easy *data,connectdata *conn,_Bool dead)

{
  (*Curl_cfree)((void *)(conn->proto).rtspc.buf.toobig);
  (conn->proto).ftpc.pp.sendsize = 0;
  (*Curl_cfree)((void *)(conn->proto).rtspc.buf.allc);
  (conn->proto).ftpc.pp.sendleft = 0;
  (*Curl_cfree)((conn->proto).smbc.recv_buf);
  (conn->proto).ftpc.pp.response_time = 0;
  (*Curl_cfree)((conn->proto).smbc.send_buf);
  (conn->proto).ftpc.pp.sendbuf.bufr = (char *)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode smb_disconnect(struct Curl_easy *data,
                               struct connectdata *conn, bool dead)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  (void) dead;
  (void) data;
  Curl_safefree(smbc->share);
  Curl_safefree(smbc->domain);
  Curl_safefree(smbc->recv_buf);
  Curl_safefree(smbc->send_buf);
  return CURLE_OK;
}